

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O3

SelectionManager * __thiscall
OpenMD::SelectionManager::replaceRigidBodiesWithAtoms
          (SelectionManager *__return_storage_ptr__,SelectionManager *this)

{
  ulong *puVar1;
  int iVar2;
  _func_int **pp_Var3;
  long lVar4;
  StuntDouble *pSVar5;
  _func_int *p_Var6;
  _func_int **pp_Var7;
  int iVar8;
  SelectionSet ssRBs;
  SelectionSet ssAtoms;
  int local_84;
  vector<int,_std::allocator<int>_> local_80;
  SelectionSet local_68;
  SelectionSet local_50;
  vector<int,_std::allocator<int>_> local_38;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_38,&this->nObjects_);
  SelectionSet::SelectionSet(&local_50,&local_38);
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  SelectionSet::clearAll(&local_50);
  std::vector<int,_std::allocator<int>_>::vector(&local_80,&this->nObjects_);
  SelectionSet::SelectionSet(&local_68,&local_80);
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  SelectionSet::clearAll(&local_68);
  SelectionManager(__return_storage_ptr__,this);
  pSVar5 = beginSelected(__return_storage_ptr__,&local_84);
  while (pSVar5 != (StuntDouble *)0x0) {
    if (pSVar5->objType_ == otRigidBody) {
      pp_Var7 = (_func_int **)pSVar5[2].mass_;
      pp_Var3 = pSVar5[2].properties_._vptr_PropertyMap;
      if ((pp_Var7 != pp_Var3) && (p_Var6 = *pp_Var7, p_Var6 != (_func_int *)0x0)) {
        lVar4 = (long)((local_50.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
        do {
          pp_Var7 = pp_Var7 + 1;
          iVar2 = *(int *)(p_Var6 + 0x28);
          iVar8 = iVar2 + 0x3f;
          if (-1 < (long)iVar2) {
            iVar8 = iVar2;
          }
          puVar1 = (ulong *)(lVar4 + (long)(iVar8 >> 6) * 8 + -8 +
                            (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        } while ((pp_Var7 != pp_Var3) && (p_Var6 = *pp_Var7, p_Var6 != (_func_int *)0x0));
      }
      iVar2 = pSVar5->globalIndex_;
      iVar8 = iVar2 + 0x3f;
      if (-1 < (long)iVar2) {
        iVar8 = iVar2;
      }
      puVar1 = (ulong *)((long)(iVar8 >> 6) * 8 +
                         (long)((local_68.bitsets_.
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + -8
                        + (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
    }
    local_84 = OpenMDBitSet::nextOnBit
                         ((__return_storage_ptr__->ss_).bitsets_.
                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                          ._M_impl.super__Vector_impl_data._M_start,local_84);
    if (local_84 == -1) break;
    pSVar5 = (__return_storage_ptr__->stuntdoubles_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start[local_84];
  }
  SelectionSet::orOperator(&__return_storage_ptr__->ss_,&local_50);
  SelectionSet::operator-=(&__return_storage_ptr__->ss_,&local_68);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_68.bitsets_);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_50.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionManager SelectionManager::replaceRigidBodiesWithAtoms() const {
    SelectionSet ssAtoms(nObjects_);
    ssAtoms.clearAll();

    SelectionSet ssRBs(nObjects_);
    ssRBs.clearAll();

    SelectionManager tempSeleMan = *this;

    StuntDouble* sd;
    int isd;
    std::vector<Atom*>::iterator ai;
    Atom* atom;
    for (sd = tempSeleMan.beginSelected(isd); sd != NULL;
         sd = tempSeleMan.nextSelected(isd)) {
      if (sd->isRigidBody()) {
        RigidBody* rb = static_cast<RigidBody*>(sd);
        for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
          ssAtoms.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
        }

        ssRBs.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());
      }
    }

    // Add the atoms in rigid bodies and remove those rigid bodies from our
    // selection set.
    tempSeleMan.ss_ |= ssAtoms;
    tempSeleMan.ss_ -= ssRBs;

    return tempSeleMan;
  }